

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_join.cpp
# Opt level: O3

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::Transformer::TransformJoin(Transformer *this,PGJoinExpr *root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  long lVar2;
  char *pcVar3;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var4;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var5;
  PGAlias *root_00;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> _Var6;
  undefined8 uVar7;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var8;
  pointer pJVar9;
  type ref;
  SelectNode *this_00;
  pointer pSVar10;
  StarExpression *this_01;
  pointer pSVar11;
  Transformer *this_02;
  type ref_00;
  pointer pSVar12;
  NotImplementedException *this_03;
  JoinRefType JVar13;
  long in_RDX;
  long *plVar14;
  _Head_base<0UL,_duckdb::JoinRef_*,_false> local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_58;
  __node_base local_50;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_48;
  __node_base local_40;
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_38;
  
  local_80._M_head_impl = (JoinRef *)operator_new(0xc0);
  ((local_80._M_head_impl)->super_TableRef).type = JOIN;
  ((local_80._M_head_impl)->super_TableRef).alias._M_dataplus._M_p =
       (pointer)&((local_80._M_head_impl)->super_TableRef).alias.field_2;
  ((local_80._M_head_impl)->super_TableRef).alias._M_string_length = 0;
  ((local_80._M_head_impl)->super_TableRef).alias.field_2._M_local_buf[0] = '\0';
  ((local_80._M_head_impl)->super_TableRef).sample.
  super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super___uniq_ptr_impl<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::SampleOptions_*,_std::default_delete<duckdb::SampleOptions>_>.
  super__Head_base<0UL,_duckdb::SampleOptions_*,_false>._M_head_impl = (SampleOptions *)0x0;
  ((local_80._M_head_impl)->super_TableRef).query_location.index = 0xffffffffffffffff;
  ((local_80._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ((local_80._M_head_impl)->super_TableRef).external_dependency.internal.
  super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ((local_80._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_80._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_80._M_head_impl)->super_TableRef).column_name_alias.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_80._M_head_impl)->super_TableRef)._vptr_TableRef = (_func_int **)&PTR__JoinRef_01982438;
  ((local_80._M_head_impl)->left).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false> = (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0
  ;
  ((local_80._M_head_impl)->right).
  super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false> = (_Head_base<0UL,_duckdb::TableRef_*,_false>)0x0
  ;
  ((local_80._M_head_impl)->condition).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  (local_80._M_head_impl)->type = INNER;
  (local_80._M_head_impl)->ref_type = REGULAR;
  ((local_80._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_80._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_80._M_head_impl)->using_columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_80._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_80._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_80._M_head_impl)->duplicate_eliminated_columns).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_80._M_head_impl)->delim_flipped = false;
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 0:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = INNER;
    break;
  case 1:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = LEFT;
    break;
  case 2:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = OUTER;
    break;
  case 3:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = RIGHT;
    break;
  case 4:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = SEMI;
    break;
  case 5:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->type = ANTI;
    break;
  default:
    this_03 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_78._0_8_ = local_68;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_78,"Join type %d not supported\n","");
    NotImplementedException::NotImplementedException<duckdb_libpgquery::PGJoinType>
              (this_03,(string *)local_78,*(PGJoinType *)(in_RDX + 4));
    __cxa_throw(this_03,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 8:
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    pJVar9->ref_type = POSITIONAL;
  }
  TransformTableRefNode((Transformer *)local_78,(PGNode *)root);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_80);
  uVar7 = local_78._0_8_;
  local_78._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->left).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar7;
  if ((_Var1._M_head_impl != (TableRef *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))(),
     (Transformer *)local_78._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  TransformTableRefNode((Transformer *)local_78,(PGNode *)root);
  pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      &local_80);
  uVar7 = local_78._0_8_;
  local_78._0_8_ = (Transformer *)0x0;
  _Var1._M_head_impl =
       (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>.
       _M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
       super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
  (pJVar9->right).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)uVar7;
  if ((_Var1._M_head_impl != (TableRef *)0x0) &&
     ((**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))(),
     (Transformer *)local_78._0_8_ != (Transformer *)0x0)) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  if (*(int *)(in_RDX + 8) == 1) {
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    JVar13 = NATURAL;
  }
  else {
    if (*(int *)(in_RDX + 8) != 2) goto LAB_007a4d37;
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    JVar13 = ASOF;
  }
  pJVar9->ref_type = JVar13;
LAB_007a4d37:
  ref = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator*
                  ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                   &local_80);
  SetQueryLocation(&ref->super_TableRef,*(int *)(in_RDX + 0x3c));
  lVar2 = *(long *)(in_RDX + 0x20);
  if ((lVar2 == 0) || (*(int *)(lVar2 + 4) < 1)) {
    if ((*(long *)(in_RDX + 0x28) == 0) &&
       ((pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                  operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                              *)&local_80),
        (pJVar9->using_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pJVar9->using_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish &&
        (pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::
                  operator->((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                              *)&local_80), pJVar9->ref_type == REGULAR)))) {
      pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                         ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *
                          )&local_80);
      pJVar9->ref_type = CROSS;
    }
    TransformExpression((Transformer *)local_78,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                       ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                        &local_80);
    uVar7 = local_78._0_8_;
    local_78._0_8_ = (Transformer *)0x0;
    _Var4._M_head_impl =
         (pJVar9->condition).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pJVar9->condition).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar7;
    if ((_Var4._M_head_impl != (ParsedExpression *)0x0) &&
       ((**(code **)(*(long *)&(_Var4._M_head_impl)->super_BaseExpression + 8))(),
       (Transformer *)local_78._0_8_ != (Transformer *)0x0)) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    if (*(long *)(in_RDX + 0x30) != 0) {
      this_00 = (SelectNode *)operator_new(0xf0);
      SelectNode::SelectNode(this_00);
      local_48._M_head_impl = this_00;
      pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_48);
      this_01 = (StarExpression *)operator_new(0x110);
      local_78._8_8_ = (ParserOptions *)0x0;
      local_68[0] = '\0';
      local_78._0_8_ = (Transformer *)local_68;
      StarExpression::StarExpression(this_01,(string *)local_78);
      if ((Transformer *)local_78._0_8_ != (Transformer *)local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      local_58._M_head_impl = (ParsedExpression *)this_01;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                  *)&pSVar10->select_list,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)&local_58);
      if ((StarExpression *)local_58._M_head_impl != (StarExpression *)0x0) {
        (*((BaseExpression *)&((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)
          ->_vptr_BaseExpression[1])();
      }
      _Var6._M_head_impl = local_80._M_head_impl;
      local_80._M_head_impl = (JoinRef *)0x0;
      pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
                operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                            *)&local_48);
      _Var1._M_head_impl =
           (pSVar10->from_table).
           super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
           super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
      (pSVar10->from_table).
      super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
      super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl =
           &(_Var6._M_head_impl)->super_TableRef;
      if (_Var1._M_head_impl != (TableRef *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
      }
      local_40._M_nxt = (_Hash_node_base *)operator_new(0x80);
      _Var8._M_head_impl = local_48._M_head_impl;
      *(undefined1 *)&local_40._M_nxt[1]._M_nxt = 1;
      local_40._M_nxt[2]._M_nxt = (_Hash_node_base *)0x0;
      local_40._M_nxt[3]._M_nxt = (_Hash_node_base *)0x0;
      local_40._M_nxt[4]._M_nxt = local_40._M_nxt + 10;
      local_40._M_nxt[5]._M_nxt = (_Hash_node_base *)&DAT_00000001;
      local_40._M_nxt[6]._M_nxt = (_Hash_node_base *)0x0;
      local_40._M_nxt[7]._M_nxt = (_Hash_node_base *)0x0;
      *(undefined4 *)&local_40._M_nxt[8]._M_nxt = 0x3f800000;
      local_40._M_nxt[9]._M_nxt = (_Hash_node_base *)0x0;
      local_40._M_nxt[10]._M_nxt = (_Hash_node_base *)0x0;
      local_40._M_nxt[0xb]._M_nxt = local_40._M_nxt + 0xd;
      local_40._M_nxt[0xc]._M_nxt = (_Hash_node_base *)0x0;
      *(undefined1 *)&local_40._M_nxt[0xd]._M_nxt = 0;
      (local_40._M_nxt)->_M_nxt = (_Hash_node_base *)&PTR__SelectStatement_01981db8;
      local_40._M_nxt[0xf]._M_nxt = (_Hash_node_base *)0x0;
      local_48._M_head_impl = (SelectNode *)0x0;
      pSVar11 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                              *)&local_40);
      _Var5._M_head_impl =
           (pSVar11->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar11->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
           &(_Var8._M_head_impl)->super_QueryNode;
      if (_Var5._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var5._M_head_impl)->_vptr_QueryNode + 8))();
      }
      this_02 = (Transformer *)operator_new(0x70);
      local_58._M_head_impl = (ParsedExpression *)local_40._M_nxt;
      local_40._M_nxt = (_Hash_node_base *)0x0;
      local_78._8_8_ = (ParserOptions *)0x0;
      local_68[0] = '\0';
      local_78._0_8_ = (Transformer *)local_68;
      SubqueryRef::SubqueryRef
                ((SubqueryRef *)this_02,
                 (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                  *)&local_58,(string *)local_78);
      local_50._M_nxt = (_Hash_node_base *)this_02;
      if ((Transformer *)local_78._0_8_ != (Transformer *)local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      if (local_58._M_head_impl != (ParsedExpression *)0x0) {
        (*(code *)((_Hash_node_base *)
                  ((local_58._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)[1]._M_nxt)()
        ;
      }
      ref_00 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
               operator*((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                          *)&local_50);
      SetQueryLocation(&ref_00->super_TableRef,*(int *)(in_RDX + 0x3c));
      root_00 = *(PGAlias **)(in_RDX + 0x30);
      pSVar12 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
                operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                            *)&local_50);
      TransformAlias((string *)local_78,(Transformer *)root,root_00,
                     &(pSVar12->super_TableRef).column_name_alias);
      pSVar12 = unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>::
                operator->((unique_ptr<duckdb::SubqueryRef,_std::default_delete<duckdb::SubqueryRef>,_true>
                            *)&local_50);
      ::std::__cxx11::string::operator=
                ((string *)&(pSVar12->super_TableRef).alias,(string *)local_78);
      if ((Transformer *)local_78._0_8_ != (Transformer *)local_68) {
        operator_delete((void *)local_78._0_8_);
      }
      (this->parent).ptr = (Transformer *)local_50._M_nxt;
      if (local_40._M_nxt != (_Hash_node_base *)0x0) {
        (*(code *)(local_40._M_nxt)->_M_nxt[1]._M_nxt)();
      }
      if (local_48._M_head_impl != (SelectNode *)0x0) {
        (*((local_48._M_head_impl)->super_QueryNode)._vptr_QueryNode[1])();
      }
      if (local_80._M_head_impl == (JoinRef *)0x0) {
        return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
      }
      (*((local_80._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>)this;
    }
  }
  else {
    plVar14 = *(long **)(lVar2 + 8);
    if (plVar14 != (long *)0x0) {
      local_38._M_head_impl = (TableRef *)this;
      do {
        pcVar3 = *(char **)(*plVar14 + 8);
        pJVar9 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                           ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>
                             *)&local_80);
        ::std::__cxx11::string::string((string *)local_78,pcVar3,(allocator *)&local_58);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pJVar9->using_columns,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
        if ((Transformer *)local_78._0_8_ != (Transformer *)local_68) {
          operator_delete((void *)local_78._0_8_);
        }
        plVar14 = (long *)plVar14[1];
        this = (Transformer *)local_38._M_head_impl;
      } while (plVar14 != (long *)0x0);
    }
  }
  *(JoinRef **)this = local_80._M_head_impl;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> Transformer::TransformJoin(duckdb_libpgquery::PGJoinExpr &root) {
	auto result = make_uniq<JoinRef>(JoinRefType::REGULAR);
	switch (root.jointype) {
	case duckdb_libpgquery::PG_JOIN_INNER: {
		result->type = JoinType::INNER;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_LEFT: {
		result->type = JoinType::LEFT;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_FULL: {
		result->type = JoinType::OUTER;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_RIGHT: {
		result->type = JoinType::RIGHT;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_SEMI: {
		result->type = JoinType::SEMI;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_ANTI: {
		result->type = JoinType::ANTI;
		break;
	}
	case duckdb_libpgquery::PG_JOIN_POSITION: {
		result->ref_type = JoinRefType::POSITIONAL;
		break;
	}
	default:
		throw NotImplementedException("Join type %d not supported\n", root.jointype);
	}

	// Check the type of the left and right argument before transforming.
	result->left = TransformTableRefNode(*root.larg);
	result->right = TransformTableRefNode(*root.rarg);

	switch (root.joinreftype) {
	case duckdb_libpgquery::PG_JOIN_NATURAL:
		result->ref_type = JoinRefType::NATURAL;
		break;
	case duckdb_libpgquery::PG_JOIN_ASOF:
		result->ref_type = JoinRefType::ASOF;
		break;
	default:
		break;
	}

	SetQueryLocation(*result, root.location);
	if (root.usingClause && root.usingClause->length > 0) {
		// usingClause is a list of strings.
		for (auto node = root.usingClause->head; node != nullptr; node = node->next) {
			auto target = PGPointerCast<duckdb_libpgquery::PGNode>(node->data.ptr_value);
			D_ASSERT(target->type == duckdb_libpgquery::T_PGString);
			auto value = PGCast<duckdb_libpgquery::PGValue>(*target.get());
			result->using_columns.push_back(string(value.val.str));
		}
		return std::move(result);
	}

	// Check if this is a cross product.
	if (!root.quals && result->using_columns.empty() && result->ref_type == JoinRefType::REGULAR) {
		result->ref_type = JoinRefType::CROSS;
	}
	result->condition = TransformExpression(root.quals);

	if (root.alias) {
		// This is a join with an alias, so we wrap it in a subquery.
		auto select_node = make_uniq<SelectNode>();
		select_node->select_list.push_back(make_uniq<StarExpression>());
		select_node->from_table = std::move(result);

		auto select = make_uniq<SelectStatement>();
		select->node = std::move(select_node);

		auto subquery = make_uniq<SubqueryRef>(std::move(select));
		SetQueryLocation(*subquery, root.location);

		// Apply the alias to the subquery.
		subquery->alias = TransformAlias(root.alias, subquery->column_name_alias);
		return std::move(subquery);
	}
	return std::move(result);
}